

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void __thiscall libtorrent::aux::utp_socket_impl::tick(utp_socket_impl *this,time_point now)

{
  byte bVar1;
  bool bVar2;
  state_t sVar3;
  int iVar4;
  uint idx;
  long *plVar5;
  packet *ppVar6;
  packet *p;
  packet *p_1;
  int i;
  duration local_38;
  long local_30;
  long local_28;
  byte local_19;
  utp_socket_impl *puStack_18;
  bool ignore_loss;
  utp_socket_impl *this_local;
  time_point now_local;
  
  puStack_18 = this;
  this_local = (utp_socket_impl *)now.__d.__r;
  sVar3 = state(this);
  if (((sVar3 != error_wait) && (sVar3 = state(this), sVar3 != deleting)) &&
     (bVar2 = ::std::chrono::operator>
                        ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&this_local,&this->m_timeout), bVar2)) {
    local_19 = 0;
    if ((((uint16_t)(this->m_acked_seq_nr + 1) == this->m_mtu_seq) &&
        ((uint16_t)(this->m_seq_nr - 1) == this->m_mtu_seq)) && (this->m_mtu_seq != 0)) {
      this->m_mtu_ceiling = this->m_mtu - 1;
      update_mtu_limits(this);
      local_19 = 1;
    }
    iVar4 = packet_buffer::size(&this->m_outbuf);
    if ((iVar4 != 0) || (this->m_close_reason != none)) {
      if ((local_19 & 1) == 0) {
        this->m_num_timeouts = this->m_num_timeouts + '\x01';
      }
      utp_socket_manager::inc_stats_counter(this->m_sm,0xa4,1);
    }
    bVar1 = this->m_num_timeouts;
    iVar4 = utp_socket_manager::num_resends(this->m_sm);
    if ((iVar4 < (int)(uint)bVar1) ||
       ((this->m_num_timeouts != '\0' && (-1 < *(short *)&this->field_0x21c)))) {
      boost::system::error_code::operator=(&this->m_error,timed_out);
      set_state(this,error_wait);
      test_socket_state(this);
    }
    else {
      if ((local_19 & 1) == 0) {
        if ((this->m_bytes_in_flight == 0) && ((long)(ulong)this->m_mtu <= this->m_cwnd >> 0x10)) {
          local_28 = (this->m_cwnd << 1) / 3;
          local_30 = (ulong)this->m_mtu << 0x10;
          plVar5 = ::std::max<long>(&local_28,&local_30);
          this->m_cwnd = *plVar5;
        }
        else {
          this->m_cwnd = (ulong)this->m_mtu << 0x10;
        }
        p_1._4_4_ = packet_timeout(this);
        ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&i,(int *)((long)&p_1 + 4));
        local_38.__r = (rep)::std::chrono::operator+
                                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&this_local,(duration<long,_std::ratio<1L,_1000L>_> *)&i);
        (this->m_timeout).__d.__r = local_38.__r;
        this->m_loss_seq_nr = this->m_seq_nr;
        *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c & 0xfdff | 0x200;
      }
      this->m_mtu_seq = 0;
      for (p_1._0_4_ = (uint)this->m_acked_seq_nr; (uint)p_1 != (this->m_seq_nr + 1 & 0xffff);
          p_1._0_4_ = (uint)p_1 + 1 & 0xffff) {
        idx = numeric_cast<unsigned_int,int,void>((uint)p_1);
        ppVar6 = packet_buffer::at(&this->m_outbuf,idx);
        if ((ppVar6 != (packet *)0x0) && (((byte)ppVar6->field_0xe >> 6 & 1) == 0)) {
          ppVar6->field_0xe = ppVar6->field_0xe & 0xbf | 0x40;
          this->m_bytes_in_flight =
               this->m_bytes_in_flight - ((uint)ppVar6->size - (uint)ppVar6->header_size);
        }
      }
      ppVar6 = packet_buffer::at(&this->m_outbuf,this->m_acked_seq_nr + 1 & 0xffff);
      if (ppVar6 == (packet *)0x0) {
        if (((byte)(*(ushort *)&this->field_0x21c >> 2) & 7) < 3) {
          send_pkt(this,0);
          sVar3 = state(this);
          if (sVar3 != error_wait) {
            state(this);
          }
        }
        else {
          sVar3 = state(this);
          if (sVar3 == fin_sent) {
            boost::system::error_code::operator=(&this->m_error,eof);
            set_state(this,error_wait);
            test_socket_state(this);
          }
        }
      }
      else {
        bVar1 = ppVar6->field_0xe;
        iVar4 = utp_socket_manager::num_resends(this->m_sm);
        if ((((int)(uint)(bVar1 & 0x3f) < iVar4) &&
            ((sVar3 = state(this), sVar3 != syn_sent ||
             (bVar1 = ppVar6->field_0xe, iVar4 = utp_socket_manager::syn_resends(this->m_sm),
             (int)(uint)(bVar1 & 0x3f) < iVar4)))) &&
           ((sVar3 = state(this), sVar3 != fin_sent ||
            (bVar1 = ppVar6->field_0xe, iVar4 = utp_socket_manager::fin_resends(this->m_sm),
            (int)(uint)(bVar1 & 0x3f) < iVar4)))) {
          if (this->m_fast_resend_seq_nr == (uint16_t)(this->m_acked_seq_nr + 1)) {
            this->m_fast_resend_seq_nr = this->m_fast_resend_seq_nr + 1;
          }
          resend_packet(this,ppVar6,false);
          sVar3 = state(this);
          if (sVar3 != error_wait) {
            state(this);
          }
        }
        else {
          if (this->m_mtu_floor < ppVar6->size) {
            utp_socket_manager::restrict_mtu(this->m_sm,(uint)this->m_mtu);
          }
          boost::system::error_code::operator=(&this->m_error,timed_out);
          set_state(this,error_wait);
          test_socket_state(this);
        }
      }
    }
  }
  return;
}

Assistant:

void utp_socket_impl::tick(time_point const now)
{
	INVARIANT_CHECK;

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: tick:%s r: %d (%s) w: %d (%s) connect: (%s)\n"
		, static_cast<void*>(this), socket_state_names[m_state], m_read
		, m_read_handler ? "handler" : "no handler"
		, m_written, m_write_handler ? "handler" : "no handler"
		, m_connect_handler ? "handler" : "no handler");
#endif

	TORRENT_ASSERT(m_outbuf.at((m_acked_seq_nr + 1) & ACK_MASK) || ((m_seq_nr - m_acked_seq_nr) & ACK_MASK) <= 1);

	// if we're already in an error state, we're just waiting for the
	// client to perform an operation so that we can communicate the
	// error. No need to do anything else with this socket
	if (state() == state_t::error_wait || state() == state_t::deleting) return;

	if (now > m_timeout)
	{
		// TIMEOUT!

		bool ignore_loss = false;

		if (((m_acked_seq_nr + 1) & ACK_MASK) == m_mtu_seq
			&& ((m_seq_nr - 1) & ACK_MASK) == m_mtu_seq
			&& m_mtu_seq != 0)
		{
			// we timed out, and the only outstanding packet
			// we had was the probe. Assume it was dropped
			// because it was too big
			m_mtu_ceiling = m_mtu - 1;
			update_mtu_limits();
			ignore_loss = true;
		}

		// the close_reason here is a bit of a hack. When it's set, it indicates
		// that the upper layer intends to close the socket. However, it has been
		// observed that the SSL shutdown sometimes can hang in a state where
		// there's no outstanding data, and it won't receive any more from the
		// other end. This catches that case and let the socket time out.
		if (m_outbuf.size() || m_close_reason != close_reason_t::none)
		{
			// m_num_timeouts is used to update the connection timeout, and if we
			// lose this packet because it's an MTU-probe, don't change the timeout
			if (!ignore_loss) ++m_num_timeouts;
			m_sm.inc_stats_counter(counters::utp_timeout);
		}

		UTP_LOGV("%8p: timeout num-timeouts: %d max-resends: %d confirmed: %d "
			" acked-seq-num: %d mtu-seq: %d\n"
			, static_cast<void*>(this)
			, m_num_timeouts
			, m_sm.num_resends()
			, m_confirmed
			, m_acked_seq_nr
			, m_mtu_seq);

		// a socket that has not been confirmed to actually have a live remote end
		// (the IP may have been spoofed) fail on the first timeout. If we had
		// heard anything from this peer, it would have been confirmed.
		if (m_num_timeouts > m_sm.num_resends()
			|| (m_num_timeouts > 0 && !m_confirmed))
		{
			// the connection is dead
			m_error = boost::asio::error::timed_out;
			set_state(state_t::error_wait);
			test_socket_state();
			return;
		}

		if (!ignore_loss)
		{
			// set cwnd to 1 MSS
			if (m_bytes_in_flight == 0 && (m_cwnd >> 16) >= m_mtu)
			{
				// this is just a timeout because this direction of
				// the stream is idle. Don't reset the cwnd, just decay it
				m_cwnd = std::max(m_cwnd * 2 / 3, std::int64_t(m_mtu) * (1 << 16));
			}
			else
			{
				// we timed out because a packet was not ACKed or because
				// the cwnd was made smaller than one packet
				m_cwnd = std::int64_t(m_mtu) * (1 << 16);
			}

			TORRENT_ASSERT(m_cwnd >= 0);

			m_timeout = now + milliseconds(packet_timeout());

			UTP_LOGV("%8p: resetting cwnd:%d\n"
				, static_cast<void*>(this), int(m_cwnd >> 16));

			// since we've already timed out now, don't count
			// loss that we might detect for packets that just
			// timed out
			m_loss_seq_nr = m_seq_nr;

			// when we time out, the cwnd is reset to 1 MSS, which means we
			// need to ramp it up quickly again. enter slow start mode. This time
			// we're very likely to have an ssthres set, which will make us leave
			// slow start before inducing more delay or loss.
			m_slow_start = true;
			UTP_LOGV("%8p: slow_start -> 1\n", static_cast<void*>(this));
		}

		// we dropped all packets, that includes the mtu probe
		m_mtu_seq = 0;

		// we need to go one past m_seq_nr to cover the case
		// where we just sent a SYN packet and then adjusted for
		// the uTorrent sequence number reuse
		for (int i = m_acked_seq_nr & ACK_MASK;
			i != ((m_seq_nr + 1) & ACK_MASK);
			i = (i + 1) & ACK_MASK)
		{
			packet* p = m_outbuf.at(aux::numeric_cast<packet_buffer::index_type>(i));
			if (!p) continue;
			if (p->need_resend) continue;
			p->need_resend = true;
			TORRENT_ASSERT(m_bytes_in_flight >= p->size - p->header_size);
			m_bytes_in_flight -= p->size - p->header_size;
			UTP_LOGV("%8p: Packet %d lost (timeout).\n", static_cast<void*>(this), i);
		}

		TORRENT_ASSERT(m_bytes_in_flight == 0);

		// if we have a packet that needs re-sending, resend it
		packet* p = m_outbuf.at((m_acked_seq_nr + 1) & ACK_MASK);
		if (p)
		{
			if (p->num_transmissions >= m_sm.num_resends()
				|| (state() == state_t::syn_sent && p->num_transmissions >= m_sm.syn_resends())
				|| (state() == state_t::fin_sent && p->num_transmissions >= m_sm.fin_resends()))
			{
#if TORRENT_UTP_LOG
				UTP_LOGV("%8p: %d failed sends in a row. Socket timed out. state:%s\n"
					, static_cast<void*>(this), p->num_transmissions, socket_state_names[m_state]);
#endif

				if (p->size > m_mtu_floor)
				{
					// the packet that caused the connection to fail was an mtu probe
					// (note that the mtu_probe field won't be set at this point because
					// it's cleared when the packet is re-sent). This suggests that
					// perhaps our network throws away oversized packets without
					// fragmenting them. Tell the socket manager to be more conservative
					// about mtu ceiling in the future
					m_sm.restrict_mtu(m_mtu);
				}
				// the connection is dead
				m_error = boost::asio::error::timed_out;
				set_state(state_t::error_wait);
				test_socket_state();
				return;
			}

			// don't fast-resend this packet
			if (m_fast_resend_seq_nr == ((m_acked_seq_nr + 1) & ACK_MASK))
				m_fast_resend_seq_nr = (m_fast_resend_seq_nr + 1) & ACK_MASK;

			// the packet timed out, resend it
			resend_packet(p);
			if (state() == state_t::error_wait || state() == state_t::deleting) return;
		}
		else if (m_state < static_cast<std::uint8_t>(state_t::fin_sent))
		{
			send_pkt();
			if (state() == state_t::error_wait || state() == state_t::deleting) return;
		}
		else if (state() == state_t::fin_sent)
		{
			// the connection is dead
			m_error = boost::asio::error::eof;
			set_state(state_t::error_wait);
			test_socket_state();
			return;
		}
	}
}